

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  AuxData *pAVar1;
  AuxData **ppAVar2;
  
  ppAVar2 = &pCtx->pVdbe->pAuxData;
  while( true ) {
    pAVar1 = *ppAVar2;
    if (pAVar1 == (AuxData *)0x0) {
      return (void *)0x0;
    }
    if ((pAVar1->iOp == pCtx->iOp) && (pAVar1->iArg == iArg)) break;
    ppAVar2 = &pAVar1->pNext;
  }
  return pAVar1->pAux;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  AuxData *pAuxData;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#if SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx->pVdbe==0 ) return 0;
#else
  assert( pCtx->pVdbe!=0 );
#endif
  for(pAuxData=pCtx->pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNext){
    if( pAuxData->iOp==pCtx->iOp && pAuxData->iArg==iArg ) break;
  }

  return (pAuxData ? pAuxData->pAux : 0);
}